

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

ArenaDtorNeeds __thiscall
google::protobuf::compiler::cpp::MessageGenerator::NeedsArenaDestructor(MessageGenerator *this)

{
  bool bVar1;
  FieldGenerator *this_00;
  ArenaDtorNeeds *pAVar2;
  Iterator IVar3;
  ArenaDtorNeeds local_5c;
  value_type local_58;
  FieldDescriptor *field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  MessageGenerator *pMStack_18;
  ArenaDtorNeeds needs;
  MessageGenerator *this_local;
  
  pMStack_18 = this;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (bVar1) {
    this_local._4_4_ = kNone;
  }
  else {
    __range3._4_4_ = kNone;
    __begin3.descriptor =
         (Descriptor *)
         protobuf::internal::FieldRange<google::protobuf::Descriptor>(this->descriptor_);
    IVar3 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::begin
                      ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __begin3._0_8_ = IVar3.descriptor;
    __end3.descriptor._0_4_ = IVar3.idx;
    IVar3 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::end
                      ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __end3._0_8_ = IVar3.descriptor;
    field._0_4_ = IVar3.idx;
    while( true ) {
      bVar1 = protobuf::internal::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field);
      if (!bVar1) break;
      local_58 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                 operator*((Iterator *)&__end3.descriptor);
      this_00 = FieldGeneratorTable::get(&this->field_generators_,local_58);
      local_5c = FieldGenerator::NeedsArenaDestructor(this_00);
      pAVar2 = std::max<google::protobuf::compiler::cpp::ArenaDtorNeeds>
                         ((ArenaDtorNeeds *)((long)&__range3 + 4),&local_5c);
      __range3._4_4_ = *pAVar2;
      protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
                ((Iterator *)&__end3.descriptor);
    }
    this_local._4_4_ = __range3._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

ArenaDtorNeeds MessageGenerator::NeedsArenaDestructor() const {
  if (HasSimpleBaseClass(descriptor_, options_)) return ArenaDtorNeeds::kNone;
  ArenaDtorNeeds needs = ArenaDtorNeeds::kNone;
  for (const auto* field : FieldRange(descriptor_)) {
    needs =
        std::max(needs, field_generators_.get(field).NeedsArenaDestructor());
  }
  return needs;
}